

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O3

void EPD_DrawBitmap(uint16_t Xpos,uint16_t Ypos,uint16_t *bmp)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  
  uVar2 = 0;
  uVar4 = gstI80DevInfo.usPanelW;
  uVar5 = gstI80DevInfo.usPanelH;
  do {
    uVar3 = 0;
    do {
      if ((uVar3 < uVar4) && (uVar2 < uVar5)) {
        uVar1 = bmp[uVar3];
        gpFrameBuf[uVar3 + uVar4 * uVar2] =
             (uint8_t)((ulong)((uVar1 & 0x1f) * 0x390 +
                               (uVar1 >> 3 & 0xfc) * 0x24b + (uVar1 >> 8 & 0xfffffff8) * 299 + 500)
                       * 0x418938 >> 0x20);
        uVar4 = gstI80DevInfo.usPanelW;
        uVar5 = gstI80DevInfo.usPanelH;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != 0x226);
    uVar2 = uVar2 + 1;
    bmp = bmp + 0x226;
  } while (uVar2 != 0x19c);
  return;
}

Assistant:

void EPD_DrawBitmap(uint16_t Xpos, uint16_t Ypos,uint16_t *bmp)
{
	uint16_t i,j;
	uint16_t R,G,B,temp;
	double Gray;

	for (j=0;j<412;j++)
	{
		for (i=0;i<550;i++)
		{
			temp = bmp[j*550+i];
			R = (temp >> 11)<<3;
			G = ((temp&0x07E0) >> 5)<<2;
			B = (temp&0x01F)<<3;
			Gray = (R*299 + G*587 + B*114 + 500) / 1000;
			EPD_DrawPixel(i, j,(uint8_t)Gray);
		}	
	}
}